

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

tokens Ident::TkFromNameLen
                 (uint32 luHash,LPCOLESTR prgch,uint32 cch,bool isStrictMode,ushort *pgrfid,
                 ushort *ptk)

{
  int iVar1;
  ushort *ptk_local;
  ushort *pgrfid_local;
  bool isStrictMode_local;
  uint32 cch_local;
  LPCOLESTR prgch_local;
  uint32 luHash_local;
  
  if (luHash < 0x9ff239) {
    if (luHash < 0x8cabb) {
      if (luHash < 0x8aff) {
        if (luHash < 0x7b70) {
          if (luHash < 0x767) {
            if (luHash == 0x75f) {
              if ((cch == 2) && (iVar1 = memcmp(g_ssym_if.sz,prgch,4), iVar1 == 0)) {
                *pgrfid = *pgrfid | 1;
                *ptk = 0x1c;
                return tkIF;
              }
            }
            else if (((luHash == 0x713) && (cch == 2)) &&
                    (iVar1 = memcmp(g_ssym_do.sz,prgch,4), iVar1 == 0)) {
              *pgrfid = *pgrfid | 1;
              *ptk = 0xf;
              return tkDO;
            }
          }
          else if (luHash == 0x767) {
            if ((cch == 2) && (iVar1 = memcmp(g_ssym_in.sz,prgch,4), iVar1 == 0)) {
              *pgrfid = *pgrfid | 1;
              *ptk = 0x1d;
              return tkIN;
            }
          }
          else if (((luHash == 0x7af7) && (cch == 3)) &&
                  (iVar1 = memcmp(g_ssym_for.sz,prgch,6), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x18;
            return tkFOR;
          }
        }
        else if (luHash == 0x7b70) {
          if ((cch == 3) && (iVar1 = memcmp(g_ssym_get.sz,prgch,6), iVar1 == 0)) {
            *ptk = 0x1a;
            return tkID;
          }
        }
        else if (luHash < 0x835a) {
          if (luHash == 0x8115) {
            if ((cch == 3) && (iVar1 = memcmp(g_ssym_let.sz,prgch,6), iVar1 == 0)) {
              *pgrfid = *pgrfid | 2;
              *ptk = 0x48;
              if (!isStrictMode) {
                return tkID;
              }
              return tkLET;
            }
          }
          else if (((luHash == 0x7e4b) && (cch == 3)) &&
                  (iVar1 = memcmp(g_ssym_int.sz,prgch,6), iVar1 == 0)) {
            *ptk = 0x1f;
            return tkID;
          }
        }
        else if (luHash == 0x835a) {
          if ((cch == 3) && (iVar1 = memcmp(g_ssym_new.sz,prgch,6), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x25;
            return tkNEW;
          }
        }
        else if (((luHash == 0x88fc) && (cch == 3)) &&
                (iVar1 = memcmp(g_ssym_set.sz,prgch,6), iVar1 == 0)) {
          *ptk = 0x2a;
          return tkID;
        }
      }
      else if (luHash == 0x8aff) {
        if ((cch == 3) && (iVar1 = memcmp(g_ssym_try.sz,prgch,6), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0x33;
          return tkTRY;
        }
      }
      else if (luHash < 0x7e974) {
        if (luHash < 0x7e17c) {
          if (luHash == 0x8c1d) {
            if ((cch == 3) && (iVar1 = memcmp(g_ssym_use.sz,prgch,6), iVar1 == 0)) {
              *ptk = 0x37;
              return tkID;
            }
          }
          else if (((luHash == 0x8c19) && (cch == 3)) &&
                  (iVar1 = memcmp(g_ssym_var.sz,prgch,6), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x39;
            return tkVAR;
          }
        }
        else if (luHash == 0x7e17c) {
          if ((cch == 4) && (iVar1 = memcmp(g_ssym_case.sz,prgch,8), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 7;
            return tkCASE;
          }
        }
        else if (((luHash == 0x7e83e) && (cch == 4)) &&
                (iVar1 = memcmp(g_ssym_char.sz,prgch,8), iVar1 == 0)) {
          *ptk = 9;
          return tkID;
        }
      }
      else if (luHash == 0x7e974) {
        if ((cch == 4) && (iVar1 = memcmp(g_ssym_byte.sz,prgch,8), iVar1 == 0)) {
          *ptk = 6;
          return tkID;
        }
      }
      else if (luHash < 0x83e29) {
        if (luHash == 0x816b5) {
          if ((cch == 4) && (iVar1 = memcmp(g_ssym_enum.sz,prgch,8), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x45;
            return tkENUM;
          }
        }
        else if (((luHash == 0x81449) && (cch == 4)) &&
                (iVar1 = memcmp(g_ssym_else.sz,prgch,8), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0x11;
          return tkELSE;
        }
      }
      else if (luHash == 0x83e29) {
        if ((cch == 4) && (iVar1 = memcmp(g_ssym_goto.sz,prgch,8), iVar1 == 0)) {
          *ptk = 0x1b;
          return tkID;
        }
      }
      else if (((luHash == 0x89db0) && (cch == 4)) &&
              (iVar1 = memcmp(g_ssym_long.sz,prgch,8), iVar1 == 0)) {
        *ptk = 0x22;
        return tkID;
      }
    }
    else if (luHash == 0x8cabb) {
      if ((cch == 4) && (iVar1 = memcmp(g_ssym_null.sz,prgch,8), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x26;
        return tkNULL;
      }
    }
    else if (luHash < 0x89c56b) {
      if (luHash < 0x96a6c) {
        if (luHash < 0x943b0) {
          if (luHash == 0x93b10) {
            if ((cch == 4) && (iVar1 = memcmp(g_ssym_true.sz,prgch,8), iVar1 == 0)) {
              *pgrfid = *pgrfid | 1;
              *ptk = 0x32;
              return tkTRUE;
            }
          }
          else if (((luHash == 0x92f08) && (cch == 4)) &&
                  (iVar1 = memcmp(g_ssym_this.sz,prgch,8), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x2e;
            return tkTHIS;
          }
        }
        else if (luHash == 0x943b0) {
          if ((cch == 4) && (iVar1 = memcmp(g_ssym_uint.sz,prgch,8), iVar1 == 0)) {
            *ptk = 0x35;
            return tkID;
          }
        }
        else if (((luHash == 0x95d42) && (cch == 4)) &&
                (iVar1 = memcmp(g_ssym_void.sz,prgch,8), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0x3a;
          return tkVOID;
        }
      }
      else if (luHash == 0x96a6c) {
        if ((cch == 4) && (iVar1 = memcmp(g_ssym_with.sz,prgch,8), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0x3d;
          return tkWITH;
        }
      }
      else if (luHash < 0x86b966) {
        if (luHash == 0x85faa3) {
          if ((cch == 5) && (iVar1 = memcmp(g_ssym_catch.sz,prgch,10), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 8;
            return tkCATCH;
          }
        }
        else if (luHash == 0x85e995) {
          if ((cch == 5) && (iVar1 = memcmp(g_ssym_break.sz,prgch,10), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 5;
            return tkBREAK;
          }
        }
        else if (((luHash == 0x84ff56) && (cch == 5)) &&
                (iVar1 = memcmp(g_ssym_await.sz,prgch,10), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 3;
          return tkAWAIT;
        }
      }
      else if (luHash == 0x86b966) {
        if ((cch == 5) && (iVar1 = memcmp(g_ssym_class.sz,prgch,10), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0x3e;
          return tkCLASS;
        }
      }
      else if (((luHash == 0x8701a7) && (cch == 5)) &&
              (iVar1 = memcmp(g_ssym_const.sz,prgch,10), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x3f;
        return tkCONST;
      }
    }
    else if (luHash == 0x89c56b) {
      if ((cch == 5) && (iVar1 = memcmp(g_ssym_false.sz,prgch,10), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x14;
        return tkFALSE;
      }
    }
    else if (luHash < 0x9ae070) {
      if (luHash < 0x8a9ac6) {
        if (luHash == 0x8a600a) {
          if ((cch == 5) && (iVar1 = memcmp(g_ssym_final.sz,prgch,10), iVar1 == 0)) {
            *ptk = 0x15;
            return tkID;
          }
        }
        else if (((luHash == 0x8a0a02) && (cch == 5)) &&
                (iVar1 = memcmp(g_ssym_event.sz,prgch,10), iVar1 == 0)) {
          *ptk = 0x13;
          return tkID;
        }
      }
      else if (luHash == 0x8a9ac6) {
        if ((cch == 5) && (iVar1 = memcmp(g_ssym_float.sz,prgch,10), iVar1 == 0)) {
          *ptk = 0x17;
          return tkID;
        }
      }
      else if (((luHash == 0x9a78a7) && (cch == 5)) &&
              (iVar1 = memcmp(g_ssym_sbyte.sz,prgch,10), iVar1 == 0)) {
        *ptk = 0x29;
        return tkID;
      }
    }
    else if (luHash == 0x9ae070) {
      if ((cch == 5) && (iVar1 = memcmp(g_ssym_short.sz,prgch,10), iVar1 == 0)) {
        *ptk = 0x2b;
        return tkID;
      }
    }
    else if (luHash < 0x9c29e4) {
      if (((luHash == 0x9bda2f) && (cch == 5)) &&
         (iVar1 = memcmp(g_ssym_super.sz,prgch,10), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x43;
        return tkSUPER;
      }
    }
    else if (luHash == 0x9c29e4) {
      if ((cch == 5) && (iVar1 = memcmp(g_ssym_throw.sz,prgch,10), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x2f;
        return tkTHROW;
      }
    }
    else if (((luHash == 0x9db965) && (cch == 5)) &&
            (iVar1 = memcmp(g_ssym_ulong.sz,prgch,10), iVar1 == 0)) {
      *ptk = 0x36;
      return tkID;
    }
  }
  else if (luHash == 0x9ff239) {
    if ((cch == 5) && (iVar1 = memcmp(g_ssym_while.sz,prgch,10), iVar1 == 0)) {
      *pgrfid = *pgrfid | 1;
      *ptk = 0x3c;
      return tkWHILE;
    }
  }
  else if (luHash < 0x70e47cd6) {
    if (luHash < 0xa2fce00) {
      if (luHash < 0x9218cf2) {
        if (luHash < 0x8ffd213) {
          if (luHash == 0x8d130f2) {
            if ((cch == 6) && (iVar1 = memcmp(g_ssym_assert.sz,prgch,0xc), iVar1 == 0)) {
              *ptk = 2;
              return tkID;
            }
          }
          else if (((luHash == 0xa28d67) && (cch == 5)) &&
                  (iVar1 = memcmp(g_ssym_yield.sz,prgch,10), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x44;
            return tkYIELD;
          }
        }
        else if (luHash == 0x8ffd213) {
          if ((cch == 6) && (iVar1 = memcmp(g_ssym_delete.sz,prgch,0xc), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0xe;
            return tkDELETE;
          }
        }
        else if (((luHash == 0x90d396b) && (cch == 6)) &&
                (iVar1 = memcmp(g_ssym_double.sz,prgch,0xc), iVar1 == 0)) {
          *ptk = 0x10;
          return tkID;
        }
      }
      else if (luHash == 0x9218cf2) {
        if ((cch == 6) && (iVar1 = memcmp(g_ssym_ensure.sz,prgch,0xc), iVar1 == 0)) {
          *ptk = 0x12;
          return tkID;
        }
      }
      else if (luHash < 0x9d3fe67) {
        if (luHash == 0x976afab) {
          if ((cch == 6) && (iVar1 = memcmp(g_ssym_import.sz,prgch,0xc), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x42;
            return tkIMPORT;
          }
        }
        else if (((luHash == 0x92e0b32) && (cch == 6)) &&
                (iVar1 = memcmp(g_ssym_export.sz,prgch,0xc), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0x40;
          return tkEXPORT;
        }
      }
      else if (luHash == 0x9d3fe67) {
        if ((cch == 6) && (iVar1 = memcmp(g_ssym_native.sz,prgch,0xc), iVar1 == 0)) {
          *ptk = 0x24;
          return tkID;
        }
      }
      else if (((luHash == 0xa17792f) && (cch == 6)) &&
              (iVar1 = memcmp(g_ssym_public.sz,prgch,0xc), iVar1 == 0)) {
        *pgrfid = *pgrfid | 2;
        *ptk = 0x4c;
        if (!isStrictMode) {
          return tkID;
        }
        return tkPUBLIC;
      }
    }
    else if (luHash == 0xa2fce00) {
      if ((cch == 6) && (iVar1 = memcmp(g_ssym_return.sz,prgch,0xc), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x28;
        return tkRETURN;
      }
    }
    else if (luHash < 0xa81b775) {
      if (luHash < 0xa5ec897) {
        if (luHash == 0xa5b93a2) {
          if ((cch == 6) && (iVar1 = memcmp(g_ssym_switch.sz,prgch,0xc), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x2c;
            return tkSWITCH;
          }
        }
        else if (((luHash == 0xa5727b8) && (cch == 6)) &&
                (iVar1 = memcmp(g_ssym_static.sz,prgch,0xc), iVar1 == 0)) {
          *pgrfid = *pgrfid | 2;
          *ptk = 0x4d;
          if (!isStrictMode) {
            return tkID;
          }
          return tkSTATIC;
        }
      }
      else if (luHash == 0xa5ec897) {
        if ((cch == 6) && (iVar1 = memcmp(g_ssym_throws.sz,prgch,0xc), iVar1 == 0)) {
          *ptk = 0x30;
          return tkID;
        }
      }
      else if (((luHash == 0xa7440a7) && (cch == 6)) &&
              (iVar1 = memcmp(g_ssym_typeof.sz,prgch,0xc), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x34;
        return tkTYPEOF;
      }
    }
    else if (luHash == 0xa81b775) {
      if ((cch == 6) && (iVar1 = memcmp(g_ssym_ushort.sz,prgch,0xc), iVar1 == 0)) {
        *ptk = 0x38;
        return tkID;
      }
    }
    else if (luHash < 0x2806f445) {
      if (((luHash == 0x1ef7ad75) && (cch == 8)) &&
         (iVar1 = memcmp(g_ssym_continue.sz,prgch,0x10), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 10;
        return tkCONTINUE;
      }
    }
    else if (luHash == 0x2806f445) {
      if ((cch == 8) && (iVar1 = memcmp(g_ssym_debugger.sz,prgch,0x10), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0xb;
        return tkDEBUGGER;
      }
    }
    else if (((luHash == 0x3189c9e0) && (cch == 0xc)) &&
            (iVar1 = memcmp(g_ssym_synchronized.sz,prgch,0x18), iVar1 == 0)) {
      *ptk = 0x2d;
      return tkID;
    }
  }
  else if (luHash == 0x70e47cd6) {
    if ((cch == 8) && (iVar1 = memcmp(g_ssym_function.sz,prgch,0x10), iVar1 == 0)) {
      *pgrfid = *pgrfid | 1;
      *ptk = 0x19;
      return tkFUNCTION;
    }
  }
  else if (luHash < 0xa9dee87c) {
    if (luHash < 0x96f94400) {
      if (luHash < 0x856af30e) {
        if (luHash == 0x79c146fa) {
          if ((cch == 10) && (iVar1 = memcmp(g_ssym_instanceof.sz,prgch,0x14), iVar1 == 0)) {
            *pgrfid = *pgrfid | 1;
            *ptk = 0x1e;
            return tkINSTANCEOF;
          }
        }
        else if (((luHash == 0x7679aa2a) && (cch == 9)) &&
                (iVar1 = memcmp(g_ssym_protected.sz,prgch,0x12), iVar1 == 0)) {
          *pgrfid = *pgrfid | 2;
          *ptk = 0x4b;
          if (!isStrictMode) {
            return tkID;
          }
          return tkPROTECTED;
        }
      }
      else if (luHash == 0x856af30e) {
        if ((cch == 10) && (iVar1 = memcmp(g_ssym_implements.sz,prgch,0x14), iVar1 == 0)) {
          *pgrfid = *pgrfid | 2;
          *ptk = 0x46;
          if (!isStrictMode) {
            return tkID;
          }
          return tkIMPLEMENTS;
        }
      }
      else if (((luHash == 0x9309f69d) && (cch == 9)) &&
              (iVar1 = memcmp(g_ssym_namespace.sz,prgch,0x12), iVar1 == 0)) {
        *ptk = 0x23;
        return tkID;
      }
    }
    else if (luHash == 0x96f94400) {
      if ((cch == 7) && (iVar1 = memcmp(g_ssym_boolean.sz,prgch,0xe), iVar1 == 0)) {
        *ptk = 4;
        return tkID;
      }
    }
    else if (luHash < 0x9c13124b) {
      if (luHash == 0x98f50305) {
        if ((cch == 7) && (iVar1 = memcmp(g_ssym_default.sz,prgch,0xe), iVar1 == 0)) {
          *pgrfid = *pgrfid | 1;
          *ptk = 0xd;
          return tkDEFAULT;
        }
      }
      else if (((luHash == 0x98f1bfff) && (cch == 7)) &&
              (iVar1 = memcmp(g_ssym_decimal.sz,prgch,0xe), iVar1 == 0)) {
        *ptk = 0xc;
        return tkID;
      }
    }
    else if (luHash == 0x9c13124b) {
      if ((cch == 7) && (iVar1 = memcmp(g_ssym_extends.sz,prgch,0xe), iVar1 == 0)) {
        *pgrfid = *pgrfid | 1;
        *ptk = 0x41;
        return tkEXTENDS;
      }
    }
    else if (((luHash == 0x9c3672ef) && (cch == 7)) &&
            (iVar1 = memcmp(g_ssym_finally.sz,prgch,0xe), iVar1 == 0)) {
      *pgrfid = *pgrfid | 1;
      *ptk = 0x16;
      return tkFINALLY;
    }
  }
  else if (luHash == 0xa9dee87c) {
    if ((cch == 7) && (iVar1 = memcmp(g_ssym_package.sz,prgch,0xe), iVar1 == 0)) {
      *pgrfid = *pgrfid | 2;
      *ptk = 0x49;
      if (!isStrictMode) {
        return tkID;
      }
      return tkPACKAGE;
    }
  }
  else if (luHash < 0xbea8c42c) {
    if (luHash < 0xb0b68a3d) {
      if (luHash == 0xad28d1bd) {
        if ((cch == 7) && (iVar1 = memcmp(g_ssym_require.sz,prgch,0xe), iVar1 == 0)) {
          *ptk = 0x27;
          return tkID;
        }
      }
      else if (((luHash == 0xab57b15b) && (cch == 7)) &&
              (iVar1 = memcmp(g_ssym_private.sz,prgch,0xe), iVar1 == 0)) {
        *pgrfid = *pgrfid | 2;
        *ptk = 0x4a;
        if (!isStrictMode) {
          return tkID;
        }
        return tkPRIVATE;
      }
    }
    else if (luHash == 0xb0b68a3d) {
      if ((cch == 8) && (iVar1 = memcmp(g_ssym_internal.sz,prgch,0x10), iVar1 == 0)) {
        *ptk = 0x20;
        return tkID;
      }
    }
    else if (((luHash == 0xbc1e9451) && (cch == 9)) &&
            (iVar1 = memcmp(g_ssym_interface.sz,prgch,0x12), iVar1 == 0)) {
      *pgrfid = *pgrfid | 2;
      *ptk = 0x47;
      if (!isStrictMode) {
        return tkID;
      }
      return tkINTERFACE;
    }
  }
  else if (luHash == 0xbea8c42c) {
    if ((cch == 9) && (iVar1 = memcmp(g_ssym_invariant.sz,prgch,0x12), iVar1 == 0)) {
      *ptk = 0x21;
      return tkID;
    }
  }
  else if (luHash < 0xe10c0168) {
    if (((luHash == 0xdbc60b24) && (cch == 8)) &&
       (iVar1 = memcmp(g_ssym_abstract.sz,prgch,0x10), iVar1 == 0)) {
      *ptk = 1;
      return tkID;
    }
  }
  else if (luHash == 0xe10c0168) {
    if ((cch == 9) && (iVar1 = memcmp(g_ssym_transient.sz,prgch,0x12), iVar1 == 0)) {
      *ptk = 0x31;
      return tkID;
    }
  }
  else if (((luHash == 0xef691640) && (cch == 8)) &&
          (iVar1 = memcmp(g_ssym_volatile.sz,prgch,0x10), iVar1 == 0)) {
    *ptk = 0x3b;
    return tkID;
  }
  return tkID;
}

Assistant:

tokens Ident::TkFromNameLen(uint32 luHash, _In_reads_(cch) LPCOLESTR prgch, uint32 cch, bool isStrictMode, ushort * pgrfid, ushort * ptk)
{
    // look for a keyword
    #include "kwds_sw.h"

    #define KEYWORD(tk,f,prec2,nop2,prec1,nop1,name) \
    LEqual_##name: \
        if (cch == g_ssym_##name.cch && \
                0 == memcmp(g_ssym_##name.sz, prgch, cch * sizeof(OLECHAR))) \
        { \
            if (f) \
                *pgrfid |= f; \
            *ptk = tk; \
            return ((f & fidKwdRsvd) || (isStrictMode && (f & fidKwdFutRsvd))) ? tk : tkID; \
        } \
        goto LDefault;
    #include "keywords.h"

LDefault:
    return tkID;
}